

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

void duckdb_lz4::LZ4_renormDictT(LZ4_stream_t_internal *LZ4_dict,int nextSize)

{
  LZ4_u32 *pLVar1;
  LZ4_u32 *pLVar2;
  uint uVar3;
  LZ4_byte *pLVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  if (0x80000000 < nextSize + LZ4_dict->currentOffset) {
    pLVar4 = LZ4_dict->dictionary;
    uVar3 = LZ4_dict->dictSize;
    uVar8 = LZ4_dict->currentOffset - 0x10000;
    lVar9 = 0;
    do {
      pLVar1 = LZ4_dict->hashTable + lVar9;
      uVar5 = pLVar1[1];
      uVar6 = pLVar1[2];
      uVar7 = pLVar1[3];
      pLVar2 = LZ4_dict->hashTable + lVar9;
      *pLVar2 = *pLVar1 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(*pLVar1 ^ 0x80000000));
      pLVar2[1] = uVar5 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar5 ^ 0x80000000));
      pLVar2[2] = uVar6 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
      pLVar2[3] = uVar7 - uVar8 & -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000));
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x1000);
    LZ4_dict->currentOffset = 0x10000;
    uVar8 = LZ4_dict->dictSize;
    if (0x10000 < uVar8) {
      LZ4_dict->dictSize = 0x10000;
      uVar8 = 0x10000;
    }
    LZ4_dict->dictionary = pLVar4 + ((ulong)uVar3 - (ulong)uVar8);
  }
  return;
}

Assistant:

static void LZ4_renormDictT(LZ4_stream_t_internal* LZ4_dict, int nextSize)
{
    assert(nextSize >= 0);
    if (LZ4_dict->currentOffset + (unsigned)nextSize > 0x80000000) {   /* potential ptrdiff_t overflow (32-bits mode) */
        /* rescale hash table */
        U32 const delta = LZ4_dict->currentOffset - 64 KB;
        const BYTE* dictEnd = LZ4_dict->dictionary + LZ4_dict->dictSize;
        int i;
        DEBUGLOG(4, "LZ4_renormDictT");
        for (i=0; i<LZ4_HASH_SIZE_U32; i++) {
            if (LZ4_dict->hashTable[i] < delta) LZ4_dict->hashTable[i]=0;
            else LZ4_dict->hashTable[i] -= delta;
        }
        LZ4_dict->currentOffset = 64 KB;
        if (LZ4_dict->dictSize > 64 KB) LZ4_dict->dictSize = 64 KB;
        LZ4_dict->dictionary = dictEnd - LZ4_dict->dictSize;
    }
}